

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_emitter_initialize(yaml_emitter_t *emitter)

{
  yaml_char_t *pyVar1;
  uchar *puVar2;
  yaml_emitter_state_t *pyVar3;
  yaml_event_t *pyVar4;
  int *piVar5;
  yaml_tag_directive_t *pyVar6;
  yaml_emitter_t *emitter_local;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x165,"int yaml_emitter_initialize(yaml_emitter_t *)");
  }
  memset(emitter,0,0x1b0);
  pyVar1 = (yaml_char_t *)yaml_malloc(0x4000);
  (emitter->buffer).start = pyVar1;
  if (pyVar1 == (yaml_char_t *)0x0) {
    emitter->error = YAML_MEMORY_ERROR;
  }
  else {
    pyVar1 = (emitter->buffer).start;
    (emitter->buffer).pointer = pyVar1;
    (emitter->buffer).last = pyVar1;
    (emitter->buffer).end = (emitter->buffer).start + 0x4000;
    puVar2 = (uchar *)yaml_malloc(0x8002);
    (emitter->raw_buffer).start = puVar2;
    if (puVar2 == (uchar *)0x0) {
      emitter->error = YAML_MEMORY_ERROR;
    }
    else {
      puVar2 = (emitter->raw_buffer).start;
      (emitter->raw_buffer).pointer = puVar2;
      (emitter->raw_buffer).last = puVar2;
      (emitter->raw_buffer).end = (emitter->raw_buffer).start + 0x8002;
      pyVar3 = (yaml_emitter_state_t *)yaml_malloc(0x40);
      (emitter->states).start = pyVar3;
      if (pyVar3 == (yaml_emitter_state_t *)0x0) {
        emitter->error = YAML_MEMORY_ERROR;
      }
      else {
        (emitter->states).top = (emitter->states).start;
        (emitter->states).end = (emitter->states).start + 0x10;
        pyVar4 = (yaml_event_t *)yaml_malloc(0x680);
        (emitter->events).start = pyVar4;
        if (pyVar4 == (yaml_event_t *)0x0) {
          emitter->error = YAML_MEMORY_ERROR;
        }
        else {
          pyVar4 = (emitter->events).start;
          (emitter->events).tail = pyVar4;
          (emitter->events).head = pyVar4;
          (emitter->events).end = (emitter->events).start + 0x10;
          piVar5 = (int *)yaml_malloc(0x40);
          (emitter->indents).start = piVar5;
          if (piVar5 == (int *)0x0) {
            emitter->error = YAML_MEMORY_ERROR;
          }
          else {
            (emitter->indents).top = (emitter->indents).start;
            (emitter->indents).end = (emitter->indents).start + 0x10;
            pyVar6 = (yaml_tag_directive_t *)yaml_malloc(0x100);
            (emitter->tag_directives).start = pyVar6;
            if (pyVar6 != (yaml_tag_directive_t *)0x0) {
              (emitter->tag_directives).top = (emitter->tag_directives).start;
              (emitter->tag_directives).end = (emitter->tag_directives).start + 0x10;
              return 1;
            }
            emitter->error = YAML_MEMORY_ERROR;
          }
        }
      }
    }
  }
  yaml_free((emitter->buffer).start);
  (emitter->buffer).end = (yaml_char_t *)0x0;
  (emitter->buffer).pointer = (yaml_char_t *)0x0;
  (emitter->buffer).start = (yaml_char_t *)0x0;
  yaml_free((emitter->raw_buffer).start);
  (emitter->raw_buffer).end = (uchar *)0x0;
  (emitter->raw_buffer).pointer = (uchar *)0x0;
  (emitter->raw_buffer).start = (uchar *)0x0;
  yaml_free((emitter->states).start);
  (emitter->states).end = (yaml_emitter_state_t *)0x0;
  (emitter->states).top = (yaml_emitter_state_t *)0x0;
  (emitter->states).start = (yaml_emitter_state_t *)0x0;
  yaml_free((emitter->events).start);
  (emitter->events).end = (yaml_event_t *)0x0;
  (emitter->events).tail = (yaml_event_t *)0x0;
  (emitter->events).head = (yaml_event_t *)0x0;
  (emitter->events).start = (yaml_event_t *)0x0;
  yaml_free((emitter->indents).start);
  (emitter->indents).end = (int *)0x0;
  (emitter->indents).top = (int *)0x0;
  (emitter->indents).start = (int *)0x0;
  yaml_free((emitter->tag_directives).start);
  (emitter->tag_directives).end = (yaml_tag_directive_t *)0x0;
  (emitter->tag_directives).top = (yaml_tag_directive_t *)0x0;
  (emitter->tag_directives).start = (yaml_tag_directive_t *)0x0;
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_initialize(yaml_emitter_t *emitter)
{
    assert(emitter);    /* Non-NULL emitter object expected. */

    memset(emitter, 0, sizeof(yaml_emitter_t));
    if (!BUFFER_INIT(emitter, emitter->buffer, OUTPUT_BUFFER_SIZE))
        goto error;
    if (!BUFFER_INIT(emitter, emitter->raw_buffer, OUTPUT_RAW_BUFFER_SIZE))
        goto error;
    if (!STACK_INIT(emitter, emitter->states, yaml_emitter_state_t*))
        goto error;
    if (!QUEUE_INIT(emitter, emitter->events, INITIAL_QUEUE_SIZE, yaml_event_t*))
        goto error;
    if (!STACK_INIT(emitter, emitter->indents, int*))
        goto error;
    if (!STACK_INIT(emitter, emitter->tag_directives, yaml_tag_directive_t*))
        goto error;

    return 1;

error:

    BUFFER_DEL(emitter, emitter->buffer);
    BUFFER_DEL(emitter, emitter->raw_buffer);
    STACK_DEL(emitter, emitter->states);
    QUEUE_DEL(emitter, emitter->events);
    STACK_DEL(emitter, emitter->indents);
    STACK_DEL(emitter, emitter->tag_directives);

    return 0;
}